

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cc
# Opt level: O3

bool __thiscall prometheus::detail::CurlWrapper::addHttpHeader(CurlWrapper *this,string *header)

{
  mutex *__mutex;
  int iVar1;
  curl_slist *pcVar2;
  undefined8 uVar3;
  
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    pcVar2 = (curl_slist *)curl_slist_append(this->optHttpHeader_,(header->_M_dataplus)._M_p);
    if (pcVar2 != (curl_slist *)0x0) {
      this->optHttpHeader_ = pcVar2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return pcVar2 != (curl_slist *)0x0;
  }
  uVar3 = ::std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

bool CurlWrapper::addHttpHeader(const std::string& header) {
  std::lock_guard<std::mutex> lock{mutex_};
  auto updated_header = curl_slist_append(optHttpHeader_, header.c_str());
  if (!updated_header) {
    return false;
  }

  optHttpHeader_ = updated_header;
  return true;
}